

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::EndMenu(void)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiWindow *parent_window;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar2 = pIVar1->ParentWindow;
  if ((((pIVar1->BeginCount == pIVar1->BeginCountPreviousFrame) && (GImGui->NavMoveDir == 0)) &&
      (bVar4 = NavMoveRequestButNoResultYet(), bVar4)) &&
     (((pIVar3->NavWindow != (ImGuiWindow *)0x0 && (pIVar3->NavWindow->RootWindowForNav == pIVar1))
      && ((pIVar2->DC).LayoutType == 1)))) {
    ClosePopupToLevel(g._4_4_,g._3_1_);
    NavMoveRequestCancel();
  }
  EndPopup();
  return;
}

Assistant:

void ImGui::EndMenu()
{
    // Nav: When a left move request our menu failed, close ourselves.
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window->Flags & ImGuiWindowFlags_Popup);  // Mismatched BeginMenu()/EndMenu() calls
    ImGuiWindow* parent_window = window->ParentWindow;  // Should always be != NULL is we passed assert.
    if (window->BeginCount == window->BeginCountPreviousFrame)
        if (g.NavMoveDir == ImGuiDir_Left && NavMoveRequestButNoResultYet())
            if (g.NavWindow && (g.NavWindow->RootWindowForNav == window) && parent_window->DC.LayoutType == ImGuiLayoutType_Vertical)
            {
                ClosePopupToLevel(g.BeginPopupStack.Size - 1, true);
                NavMoveRequestCancel();
            }

    EndPopup();
}